

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_stats_striped_sse41_128_64.c
# Opt level: O1

parasail_result_t *
parasail_sg_flags_stats_table_striped_profile_sse41_128_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  ulong uVar1;
  long *plVar2;
  size_t *psVar3;
  uint uVar4;
  void *pvVar5;
  parasail_matrix_t *ppVar6;
  void *pvVar7;
  void *pvVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  int iVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  parasail_result_t *ppVar16;
  __m128i *palVar17;
  __m128i *ptr;
  __m128i *b;
  __m128i *ptr_00;
  __m128i *b_00;
  __m128i *ptr_01;
  __m128i *b_01;
  __m128i *ptr_02;
  __m128i *ptr_03;
  __m128i *b_02;
  __m128i *b_03;
  __m128i *b_04;
  int64_t *ptr_04;
  long lVar18;
  long lVar19;
  int iVar20;
  ulong uVar21;
  size_t len;
  size_t sVar22;
  long lVar23;
  long lVar24;
  size_t sVar25;
  size_t sVar26;
  uint uVar27;
  undefined8 extraout_RDX;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  ulong uVar28;
  int iVar29;
  __m128i *ptr_05;
  long lVar30;
  uint uVar31;
  ulong uVar32;
  size_t sVar33;
  long lVar34;
  size_t sVar35;
  ulong uVar36;
  ulong uVar37;
  long lVar38;
  int iVar39;
  int iVar40;
  long lVar41;
  long lVar42;
  long lVar43;
  size_t sVar44;
  long lVar45;
  ulong uVar46;
  ulong uVar47;
  uint uVar48;
  ulong uVar49;
  ulong uVar50;
  long lVar51;
  longlong lVar52;
  undefined1 auVar53 [16];
  long lVar60;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  int64_t iVar61;
  size_t sVar62;
  longlong lVar64;
  size_t sVar69;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  size_t sVar63;
  size_t sVar70;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  longlong lVar71;
  __m128i_64_t B_6;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  long lVar75;
  longlong lVar76;
  __m128i_64_t B_8;
  long lVar81;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  size_t sVar82;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  __m128i_64_t B_7;
  undefined1 auVar83 [16];
  __m128i_64_t B_5;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  long lVar87;
  undefined1 auVar86 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  long lVar98;
  __m128i_64_t B_1;
  long lVar100;
  undefined1 auVar99 [16];
  undefined1 auVar101 [16];
  __m128i_64_t B_2;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  __m128i_64_t B_3;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  __m128i alVar108;
  __m128i c;
  __m128i c_00;
  __m128i c_01;
  __m128i c_02;
  __m128i c_03;
  __m128i_64_t B;
  __m128i_64_t e;
  __m128i_64_t h;
  int local_28c;
  ulong local_260;
  long local_248;
  __m128i *local_238;
  __m128i *local_230;
  __m128i *local_228;
  undefined1 local_198 [16];
  size_t sStack_170;
  ulong uStack_d0;
  longlong local_58 [5];
  longlong extraout_RDX_00;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sg_flags_stats_table_striped_profile_sse41_128_64_cold_8();
  }
  else {
    pvVar5 = (profile->profile64).score;
    if (pvVar5 == (void *)0x0) {
      parasail_sg_flags_stats_table_striped_profile_sse41_128_64_cold_7();
    }
    else {
      ppVar6 = profile->matrix;
      if (ppVar6 == (parasail_matrix_t *)0x0) {
        parasail_sg_flags_stats_table_striped_profile_sse41_128_64_cold_6();
      }
      else {
        uVar4 = profile->s1Len;
        if ((int)uVar4 < 1) {
          parasail_sg_flags_stats_table_striped_profile_sse41_128_64_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sg_flags_stats_table_striped_profile_sse41_128_64_cold_4();
        }
        else {
          uVar36 = (ulong)(uint)s2Len;
          if (s2Len < 1) {
            parasail_sg_flags_stats_table_striped_profile_sse41_128_64_cold_3();
          }
          else if (open < 0) {
            parasail_sg_flags_stats_table_striped_profile_sse41_128_64_cold_2();
          }
          else if (gap < 0) {
            parasail_sg_flags_stats_table_striped_profile_sse41_128_64_cold_1();
          }
          else {
            iVar12 = uVar4 - 1;
            uVar46 = (ulong)uVar4 + 1;
            uVar49 = uVar46 >> 1;
            uVar48 = (uint)uVar49;
            iVar29 = iVar12 / (int)uVar48;
            uVar27 = iVar12 % (int)uVar48;
            pvVar7 = (profile->profile64).matches;
            pvVar8 = (profile->profile64).similar;
            uVar21 = (ulong)(uint)open;
            iVar39 = -open;
            iVar20 = ppVar6->min;
            uVar47 = 0x8000000000000000 - (long)iVar20;
            if (iVar20 != iVar39 && SBORROW4(iVar20,iVar39) == iVar20 + open < 0) {
              uVar47 = uVar21 | 0x8000000000000000;
            }
            iVar20 = ppVar6->max;
            ppVar16 = parasail_result_new_table3((uint)uVar46 & 0x7ffffffe,s2Len);
            if (ppVar16 != (parasail_result_t *)0x0) {
              ppVar16->flag =
                   (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe
                   | (uint)(s2_end != 0) << 0xf | ppVar16->flag | 0x2830802;
              palVar17 = parasail_memalign___m128i(0x10,uVar49);
              ptr = parasail_memalign___m128i(0x10,uVar49);
              b = parasail_memalign___m128i(0x10,uVar49);
              ptr_00 = parasail_memalign___m128i(0x10,uVar49);
              b_00 = parasail_memalign___m128i(0x10,uVar49);
              ptr_01 = parasail_memalign___m128i(0x10,uVar49);
              b_01 = parasail_memalign___m128i(0x10,uVar49);
              ptr_02 = parasail_memalign___m128i(0x10,uVar49);
              ptr_03 = parasail_memalign___m128i(0x10,uVar49);
              b_02 = parasail_memalign___m128i(0x10,uVar49);
              b_03 = parasail_memalign___m128i(0x10,uVar49);
              b_04 = parasail_memalign___m128i(0x10,uVar49);
              ptr_04 = parasail_memalign_int64_t(0x10,(ulong)(s2Len + 1));
              alVar108[1]._1_7_ = (undefined7)((ulong)extraout_RDX >> 8);
              alVar108[1]._0_1_ =
                   (b_03 == (__m128i *)0x0 ||
                   (b_02 == (__m128i *)0x0 || (ptr_03 == (__m128i *)0x0 || ptr_02 == (__m128i *)0x0)
                   )) || ((b_01 == (__m128i *)0x0 ||
                          (ptr_01 == (__m128i *)0x0 || b_00 == (__m128i *)0x0)) ||
                         ((ptr_00 == (__m128i *)0x0 || b == (__m128i *)0x0) ||
                         (ptr == (__m128i *)0x0 || palVar17 == (__m128i *)0x0)));
              if ((ptr_04 != (int64_t *)0x0 && b_04 != (__m128i *)0x0) &&
                  ((b_03 != (__m128i *)0x0 &&
                   (b_02 != (__m128i *)0x0 && (ptr_03 != (__m128i *)0x0 && ptr_02 != (__m128i *)0x0)
                   )) && ((b_01 != (__m128i *)0x0 &&
                          (ptr_01 != (__m128i *)0x0 && b_00 != (__m128i *)0x0)) &&
                         ((ptr_00 != (__m128i *)0x0 && b != (__m128i *)0x0) &&
                         (ptr != (__m128i *)0x0 && palVar17 != (__m128i *)0x0))))) {
                iVar13 = s2Len + -1;
                iVar14 = 1 - iVar29;
                uVar50 = (ulong)(uint)gap;
                uVar1 = uVar47 + 1;
                len = 0x7ffffffffffffffe - (long)iVar20;
                auVar53._8_4_ = (int)uVar1;
                auVar53._0_8_ = uVar1;
                auVar53._12_4_ = (int)(uVar1 >> 0x20);
                auVar92._8_4_ = (int)len;
                auVar92._0_8_ = len;
                auVar92._12_4_ = (int)(len >> 0x20);
                auVar97._0_8_ = (long)iVar14;
                auVar97._8_4_ = iVar14;
                auVar97._12_4_ = iVar14 >> 0x1f;
                alVar108[0] = uVar49;
                sVar22 = len;
                parasail_memset___m128i(b,alVar108,len);
                c[1] = extraout_RDX_00;
                c[0] = uVar49;
                parasail_memset___m128i(b_00,c,sVar22);
                c_00[1] = extraout_RDX_01;
                c_00[0] = uVar49;
                parasail_memset___m128i(b_01,c_00,sVar22);
                c_01[1] = extraout_RDX_02;
                c_01[0] = uVar49;
                parasail_memset___m128i(b_02,c_01,sVar22);
                c_02[1] = extraout_RDX_03;
                c_02[0] = uVar49;
                parasail_memset___m128i(b_03,c_02,sVar22);
                c_03[1] = extraout_RDX_04;
                c_03[0] = uVar49;
                parasail_memset___m128i(b_04,c_03,sVar22);
                lVar23 = (long)iVar39;
                uVar32 = 0;
                do {
                  lVar41 = 0;
                  lVar38 = lVar23;
                  do {
                    lVar42 = lVar38;
                    if (s1_beg != 0) {
                      lVar42 = 0;
                    }
                    local_58[lVar41 + 2] = lVar42;
                    local_58[lVar41] = lVar42 - uVar21;
                    lVar41 = lVar41 + 1;
                    lVar38 = lVar38 - uVar49 * (uint)gap;
                  } while (lVar41 == 1);
                  palVar17[uVar32][0] = local_58[2];
                  palVar17[uVar32][1] = local_58[3];
                  ptr_03[uVar32][0] = local_58[0];
                  ptr_03[uVar32][1] = local_58[1];
                  uVar32 = uVar32 + 1;
                  lVar23 = lVar23 - (ulong)(uint)gap;
                } while (uVar32 != uVar49);
                *ptr_04 = 0;
                uVar32 = 1;
                iVar20 = iVar39;
                do {
                  iVar14 = 0;
                  if (s2_beg == 0) {
                    iVar14 = iVar20;
                  }
                  ptr_04[uVar32] = (long)iVar14;
                  uVar32 = uVar32 + 1;
                  iVar20 = iVar20 - gap;
                } while (s2Len + 1 != uVar32);
                uVar31 = uVar48 - 1;
                uVar32 = 1;
                if (1 < s2Len) {
                  uVar32 = uVar36;
                }
                lVar38 = uVar49 * uVar36 * 4;
                lVar41 = uVar36 * 4;
                lVar42 = (ulong)(uVar48 + (uVar48 == 0)) << 4;
                lVar43 = 0;
                local_198._8_8_ = auVar97._8_8_;
                local_198._8_8_ = -(ulong)(local_198._8_8_ == 0);
                local_198._0_8_ = -(ulong)(auVar97._0_8_ == 1);
                uVar36 = 0;
                sStack_170 = auVar92._8_8_;
                lVar23 = lVar38;
                auVar67 = auVar53;
                auVar73 = auVar53;
                auVar80 = auVar53;
                auVar83 = auVar53;
                auVar101 = auVar53;
                sVar22 = len;
                local_28c = iVar13;
                do {
                  local_228 = ptr_00;
                  local_230 = ptr_01;
                  local_238 = ptr_02;
                  ptr_01 = b_00;
                  ptr_02 = b_01;
                  ptr_00 = b;
                  ptr_05 = ptr;
                  ptr = palVar17;
                  lVar76 = ptr_00[uVar31][0];
                  lVar71 = ptr_01[uVar31][0];
                  lVar64 = ptr_02[uVar31][0];
                  palVar17 = ptr + uVar31;
                  auVar77._8_4_ = (int)(*palVar17)[0];
                  auVar77._0_8_ = (*palVar17)[0];
                  auVar77._12_4_ = *(undefined4 *)((long)*palVar17 + 4);
                  lVar81 = 0;
                  lVar87 = 0;
                  iVar61 = ptr_04[uVar36];
                  lVar19 = auVar77._8_8_;
                  lVar75 = 0;
                  lVar24 = (long)ppVar6->mapper[(byte)s2[uVar36]] * (long)(int)uVar48 * 0x10;
                  auVar92 = ZEXT816(0);
                  lVar18 = 0;
                  auVar97 = ZEXT816(0);
                  lVar45 = lVar43;
                  auVar94 = _DAT_008d0e90;
                  auVar85 = auVar53;
                  local_248 = lVar23;
                  do {
                    plVar2 = (long *)((long)*ptr_03 + lVar18);
                    lVar51 = *plVar2;
                    lVar60 = plVar2[1];
                    sVar63 = *(size_t *)((long)*ptr_03 + lVar18);
                    sVar70 = *(size_t *)((long)*ptr_03 + lVar18 + 8);
                    auVar77 = *(undefined1 (*) [16])((long)*b_02 + lVar18);
                    plVar2 = (long *)((long)pvVar5 + lVar18 + lVar24);
                    sVar62 = iVar61 + *plVar2;
                    sVar69 = lVar19 + plVar2[1];
                    if ((long)sVar63 < (long)sVar62) {
                      sVar63 = sVar62;
                    }
                    auVar78 = *(undefined1 (*) [16])((long)*b_03 + lVar18);
                    if ((long)sVar70 < (long)sVar69) {
                      sVar70 = sVar69;
                    }
                    sVar25 = auVar85._0_8_;
                    if ((long)sVar63 <= (long)sVar25) {
                      sVar63 = sVar25;
                    }
                    sVar35 = auVar85._8_8_;
                    auVar85 = *(undefined1 (*) [16])((long)*b_04 + lVar18);
                    if ((long)sVar70 <= (long)sVar35) {
                      sVar70 = sVar35;
                    }
                    psVar3 = (size_t *)((long)*ptr_05 + lVar18);
                    *psVar3 = sVar63;
                    psVar3[1] = sVar70;
                    auVar105._0_8_ = -(ulong)(sVar63 == sVar25);
                    auVar105._8_8_ = -(ulong)(sVar70 == sVar35);
                    auVar102 = blendvpd(auVar77,auVar97,auVar105);
                    plVar2 = (long *)((long)pvVar7 + lVar18 + lVar24);
                    auVar103._0_8_ = lVar81 + *plVar2;
                    auVar103._8_8_ = lVar76 + plVar2[1];
                    auVar65._0_8_ = -(ulong)(sVar62 == sVar63);
                    auVar65._8_8_ = -(ulong)(sVar69 == sVar70);
                    auVar103 = blendvpd(auVar102,auVar103,auVar65);
                    auVar102 = blendvpd(auVar78,auVar92,auVar105);
                    *(undefined1 (*) [16])((long)*local_228 + lVar18) = auVar103;
                    plVar2 = (long *)((long)pvVar8 + lVar18 + lVar24);
                    auVar104._0_8_ = lVar87 + *plVar2;
                    auVar104._8_8_ = lVar71 + plVar2[1];
                    auVar104 = blendvpd(auVar102,auVar104,auVar65);
                    auVar105 = blendvpd(auVar85,auVar94,auVar105);
                    auVar102._8_4_ = 0xffffffff;
                    auVar102._0_8_ = 0xffffffffffffffff;
                    auVar102._12_4_ = 0xffffffff;
                    auVar89._0_8_ = lVar75 + 1;
                    auVar89._8_8_ = lVar64 - auVar102._8_8_;
                    auVar102 = blendvpd(auVar105,auVar89,auVar65);
                    if ((long)sVar63 <= (long)sVar22) {
                      sVar22 = sVar63;
                    }
                    if ((long)sVar70 <= (long)sStack_170) {
                      sStack_170 = sVar70;
                    }
                    sVar62 = auVar101._0_8_;
                    if ((long)auVar101._0_8_ <= (long)sVar63) {
                      sVar62 = sVar63;
                    }
                    sVar69 = auVar101._8_8_;
                    if ((long)auVar101._8_8_ <= (long)sVar70) {
                      sVar69 = sVar70;
                    }
                    if ((long)sVar62 <= (long)auVar103._0_8_) {
                      sVar62 = auVar103._0_8_;
                    }
                    if ((long)sVar69 <= (long)auVar103._8_8_) {
                      sVar69 = auVar103._8_8_;
                    }
                    if ((long)sVar62 <= (long)auVar104._0_8_) {
                      sVar62 = auVar104._0_8_;
                    }
                    *(undefined1 (*) [16])((long)*local_230 + lVar18) = auVar104;
                    if ((long)sVar69 <= (long)auVar104._8_8_) {
                      sVar69 = auVar104._8_8_;
                    }
                    sVar33 = auVar102._0_8_;
                    if ((long)sVar62 <= (long)sVar33) {
                      sVar62 = sVar33;
                    }
                    sVar26 = auVar102._8_8_;
                    *(undefined1 (*) [16])((long)*local_238 + lVar18) = auVar102;
                    if ((long)sVar69 <= (long)sVar26) {
                      sVar69 = sVar26;
                    }
                    lVar19 = *(long *)((long)((ppVar16->field_4).trace)->trace_del_table + 8);
                    *(int *)(lVar19 + lVar45) = auVar103._0_4_;
                    *(int *)(lVar19 + local_248) = auVar103._8_4_;
                    lVar19 = *(long *)((long)((ppVar16->field_4).trace)->trace_del_table + 0x10);
                    *(int *)(lVar19 + lVar45) = auVar104._0_4_;
                    *(int *)(lVar19 + local_248) = auVar104._8_4_;
                    lVar19 = *(long *)((long)((ppVar16->field_4).trace)->trace_del_table + 0x18);
                    *(int *)(lVar19 + lVar45) = auVar102._0_4_;
                    *(int *)(lVar19 + local_248) = auVar102._8_4_;
                    lVar75 = sVar63 - (uint)open;
                    lVar81 = sVar70 - (uint)open;
                    uStack_d0 = (ulong)(uint)gap;
                    lVar51 = lVar51 - uVar50;
                    lVar60 = lVar60 - uStack_d0;
                    lVar19 = lVar51;
                    if (lVar51 < lVar75) {
                      lVar19 = lVar75;
                    }
                    lVar87 = lVar60;
                    if (lVar60 < lVar81) {
                      lVar87 = lVar81;
                    }
                    lVar98 = sVar25 - uVar50;
                    lVar100 = sVar35 - uStack_d0;
                    lVar30 = lVar98;
                    if (lVar98 < lVar75) {
                      lVar30 = lVar75;
                    }
                    lVar34 = lVar100;
                    if (lVar100 < lVar81) {
                      lVar34 = lVar81;
                    }
                    auVar54._8_8_ = -(ulong)(lVar60 < lVar81);
                    auVar54._0_8_ = -(ulong)(lVar51 < lVar75);
                    auVar102 = pblendvb(auVar77,auVar103,auVar54);
                    auVar77 = pblendvb(auVar78,auVar104,auVar54);
                    auVar72._8_4_ = 0xffffffff;
                    auVar72._0_8_ = 0xffffffffffffffff;
                    auVar72._12_4_ = 0xffffffff;
                    auVar84._0_8_ = auVar85._0_8_ + 1;
                    auVar84._8_8_ = auVar85._8_8_ - auVar72._8_8_;
                    auVar106._0_8_ = sVar33 + 1;
                    auVar106._8_8_ = sVar26 - auVar72._8_8_;
                    auVar90._8_4_ = 0xffffffff;
                    auVar90._0_8_ = 0xffffffffffffffff;
                    auVar90._12_4_ = 0xffffffff;
                    auVar85 = pblendvb(auVar84,auVar106,auVar54);
                    auVar78._8_8_ = -(ulong)(lVar100 < lVar81);
                    auVar78._0_8_ = -(ulong)(lVar98 < lVar75);
                    auVar97 = pblendvb(auVar97,auVar103,auVar78);
                    auVar101._8_8_ = sVar69;
                    auVar101._0_8_ = sVar62;
                    lVar75 = *((ppVar16->field_4).trace)->trace_del_table;
                    *(int *)(lVar75 + lVar45) = (int)sVar63;
                    *(int *)(lVar75 + local_248) = (int)sVar70;
                    plVar2 = (long *)((long)*ptr_03 + lVar18);
                    *plVar2 = lVar19;
                    plVar2[1] = lVar87;
                    *(undefined1 (*) [16])((long)*b_02 + lVar18) = auVar102;
                    *(undefined1 (*) [16])((long)*b_03 + lVar18) = auVar77;
                    *(undefined1 (*) [16])((long)*b_04 + lVar18) = auVar85;
                    auVar85._8_8_ = lVar34;
                    auVar85._0_8_ = lVar30;
                    auVar92 = pblendvb(auVar92,auVar104,auVar78);
                    auVar93._0_8_ = auVar94._0_8_ + 1;
                    auVar93._8_8_ = auVar94._8_8_ - auVar90._8_8_;
                    auVar94 = pblendvb(auVar93,auVar106,auVar78);
                    plVar2 = (long *)((long)*ptr + lVar18);
                    iVar61 = *plVar2;
                    lVar19 = plVar2[1];
                    plVar2 = (long *)((long)*ptr_00 + lVar18);
                    lVar81 = *plVar2;
                    lVar76 = plVar2[1];
                    plVar2 = (long *)((long)*ptr_01 + lVar18);
                    lVar87 = *plVar2;
                    lVar71 = plVar2[1];
                    plVar2 = (long *)((long)*ptr_02 + lVar18);
                    lVar75 = *plVar2;
                    lVar64 = plVar2[1];
                    lVar18 = lVar18 + 0x10;
                    local_248 = local_248 + lVar41;
                    lVar45 = lVar45 + lVar41;
                  } while (lVar42 != lVar18);
                  iVar20 = 0;
                  auVar107._8_4_ = 0xffffffff;
                  auVar107._0_8_ = 0xffffffffffffffff;
                  auVar107._12_4_ = 0xffffffff;
                  do {
                    alVar108 = ptr[uVar31];
                    lVar19 = (long)iVar39;
                    if (s2_beg == 0) {
                      lVar19 = ptr_04[uVar36 + 1] - uVar21;
                    }
                    auVar66._0_8_ = alVar108[0];
                    auVar66._8_4_ = (int)alVar108[0];
                    auVar66._12_4_ = alVar108[0]._4_4_;
                    auVar99._0_8_ = auVar85._0_8_;
                    auVar99._8_4_ = auVar85._0_4_;
                    auVar99._12_4_ = auVar85._4_4_;
                    auVar10._8_8_ = 0;
                    auVar10._0_8_ = auVar97._0_8_;
                    auVar97 = auVar10 << 0x40;
                    auVar11._8_8_ = 0;
                    auVar11._0_8_ = auVar92._0_8_;
                    auVar92 = auVar11 << 0x40;
                    auVar95._0_8_ = auVar94._0_8_;
                    auVar95._8_4_ = auVar94._0_4_;
                    auVar95._12_4_ = auVar94._4_4_;
                    sVar63 = ptr_04[uVar36];
                    sVar70 = auVar66._8_8_;
                    auVar85._8_8_ = auVar99._8_8_;
                    auVar85._0_8_ = lVar19;
                    auVar94._8_8_ = auVar95._8_8_;
                    auVar94._0_8_ = 1;
                    lVar75 = 0;
                    lVar19 = lVar43;
                    do {
                      plVar2 = (long *)((long)pvVar5 + lVar75 + lVar24);
                      sVar63 = sVar63 + *plVar2;
                      sVar70 = sVar70 + plVar2[1];
                      sVar35 = auVar85._0_8_;
                      sVar62 = *(size_t *)((long)*ptr_05 + lVar75);
                      sVar69 = *(size_t *)((long)*ptr_05 + lVar75 + 8);
                      sVar25 = sVar35;
                      if ((long)sVar35 < (long)sVar62) {
                        sVar25 = sVar62;
                      }
                      sVar33 = auVar85._8_8_;
                      sVar62 = sVar33;
                      if ((long)sVar33 < (long)sVar69) {
                        sVar62 = sVar69;
                      }
                      psVar3 = (size_t *)((long)*ptr_05 + lVar75);
                      *psVar3 = sVar25;
                      psVar3[1] = sVar62;
                      auVar56._0_8_ = -(ulong)(sVar25 == sVar35);
                      auVar56._8_8_ = -(ulong)(sVar62 == sVar33);
                      auVar55._0_8_ = -(ulong)(sVar25 == sVar63);
                      auVar55._8_8_ = -(ulong)(sVar62 == sVar70);
                      auVar56 = ~auVar55 & auVar56;
                      auVar77 = blendvpd(*(undefined1 (*) [16])((long)*local_228 + lVar75),auVar97,
                                         auVar56);
                      *(undefined1 (*) [16])((long)*local_228 + lVar75) = auVar77;
                      auVar102 = blendvpd(*(undefined1 (*) [16])((long)*local_230 + lVar75),auVar92,
                                          auVar56);
                      *(undefined1 (*) [16])((long)*local_230 + lVar75) = auVar102;
                      auVar78 = blendvpd(*(undefined1 (*) [16])((long)*local_238 + lVar75),auVar94,
                                         auVar56);
                      if ((long)sVar25 <= (long)sVar22) {
                        sVar22 = sVar25;
                      }
                      if ((long)sVar62 <= (long)sStack_170) {
                        sStack_170 = sVar62;
                      }
                      sVar69 = auVar101._0_8_;
                      if ((long)auVar101._0_8_ <= (long)sVar25) {
                        sVar69 = sVar25;
                      }
                      sVar26 = auVar101._8_8_;
                      if ((long)auVar101._8_8_ <= (long)sVar62) {
                        sVar26 = sVar62;
                      }
                      if ((long)sVar69 <= (long)auVar77._0_8_) {
                        sVar69 = auVar77._0_8_;
                      }
                      if ((long)sVar26 <= (long)auVar77._8_8_) {
                        sVar26 = auVar77._8_8_;
                      }
                      if ((long)sVar69 <= (long)auVar102._0_8_) {
                        sVar69 = auVar102._0_8_;
                      }
                      *(undefined1 (*) [16])((long)*local_238 + lVar75) = auVar78;
                      if ((long)sVar26 <= (long)auVar102._8_8_) {
                        sVar26 = auVar102._8_8_;
                      }
                      sVar44 = auVar78._0_8_;
                      if ((long)sVar69 <= (long)sVar44) {
                        sVar69 = sVar44;
                      }
                      sVar82 = auVar78._8_8_;
                      if ((long)sVar26 <= (long)sVar82) {
                        sVar26 = sVar82;
                      }
                      lVar81 = *(long *)((long)((ppVar16->field_4).trace)->trace_del_table + 8);
                      *(int *)(lVar81 + lVar19) = auVar77._0_4_;
                      *(int *)(lVar38 + lVar81 + lVar19) = auVar77._8_4_;
                      lVar81 = *(long *)((long)((ppVar16->field_4).trace)->trace_del_table + 0x10);
                      *(int *)(lVar81 + lVar19) = auVar102._0_4_;
                      *(int *)(lVar38 + lVar81 + lVar19) = auVar102._8_4_;
                      lVar81 = *(long *)((long)((ppVar16->field_4).trace)->trace_del_table + 0x18);
                      *(int *)(lVar81 + lVar19) = auVar78._0_4_;
                      *(int *)(lVar38 + lVar81 + lVar19) = auVar78._8_4_;
                      lVar81 = *((ppVar16->field_4).trace)->trace_del_table;
                      *(int *)(lVar81 + lVar19) = (int)sVar25;
                      *(int *)(lVar38 + lVar81 + lVar19) = (int)sVar62;
                      lVar81 = sVar25 - (uint)open;
                      lVar87 = sVar62 - (uint)open;
                      auVar88._0_8_ = sVar35 - uVar50;
                      auVar88._8_8_ = sVar33 - uStack_d0;
                      auVar91._8_8_ = -(ulong)(lVar87 < auVar88._8_8_);
                      auVar91._0_8_ = -(ulong)(lVar81 < auVar88._0_8_);
                      auVar86._0_8_ = -(ulong)(lVar81 == auVar88._0_8_);
                      auVar86._8_8_ = -(ulong)(lVar87 == auVar88._8_8_);
                      auVar86 = auVar86 | auVar91;
                      if ((((((((((((((((auVar86 >> 7 & (undefined1  [16])0x1) ==
                                        (undefined1  [16])0x0 &&
                                       (auVar86 >> 0xf & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                      (auVar86 >> 0x17 & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0) &&
                                     (auVar86 >> 0x1f & (undefined1  [16])0x1) ==
                                     (undefined1  [16])0x0) &&
                                    (auVar86 >> 0x27 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                                   (auVar86 >> 0x2f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                                  (auVar86 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                  ) && (auVar86 >> 0x3f & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                (auVar86 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                               && (auVar86 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar86 >> 0x57 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                             (auVar86 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar86 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar86 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar86 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          -1 < auVar86[0xf]) {
                        iVar14 = 0x27;
                      }
                      else {
                        auVar57._8_8_ = -(ulong)(auVar88._8_8_ < lVar87);
                        auVar57._0_8_ = -(ulong)(auVar88._0_8_ < lVar81);
                        auVar97 = pblendvb(auVar97,auVar77,auVar57);
                        auVar92 = pblendvb(auVar92,auVar102,auVar57);
                        auVar96._0_8_ = auVar94._0_8_ + 1;
                        auVar96._8_8_ = auVar94._8_8_ - auVar107._8_8_;
                        auVar79._0_8_ = sVar44 + 1;
                        auVar79._8_8_ = sVar82 - auVar107._8_8_;
                        auVar94 = pblendvb(auVar96,auVar79,auVar57);
                        psVar3 = (size_t *)((long)*ptr + lVar75);
                        sVar63 = *psVar3;
                        sVar70 = psVar3[1];
                        iVar14 = 0;
                        auVar85 = auVar88;
                      }
                      auVar101._8_8_ = sVar26;
                      auVar101._0_8_ = sVar69;
                      if ((((((((((((((((auVar86 >> 7 & (undefined1  [16])0x1) ==
                                        (undefined1  [16])0x0 &&
                                       (auVar86 >> 0xf & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                      (auVar86 >> 0x17 & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0) &&
                                     (auVar86 >> 0x1f & (undefined1  [16])0x1) ==
                                     (undefined1  [16])0x0) &&
                                    (auVar86 >> 0x27 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                                   (auVar86 >> 0x2f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                                  (auVar86 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                  ) && (auVar86 >> 0x3f & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                (auVar86 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                               && (auVar86 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar86 >> 0x57 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                             (auVar86 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar86 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar86 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar86 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          -1 < auVar86[0xf]) goto LAB_006cac58;
                      lVar75 = lVar75 + 0x10;
                      lVar19 = lVar19 + lVar41;
                    } while (lVar42 != lVar75);
                    iVar14 = 0;
LAB_006cac58:
                    bVar9 = iVar20 == 0;
                    iVar20 = iVar20 + 1;
                  } while (iVar14 == 0 && bVar9);
                  alVar108 = ptr_05[uVar27];
                  auVar58._0_8_ = -(ulong)(auVar83._0_8_ < alVar108[0]);
                  auVar58._8_8_ = -(ulong)(auVar83._8_8_ < alVar108[1]);
                  uVar15 = movmskpd(iVar20,auVar58);
                  auVar59._8_8_ = -(ulong)(byte)((byte)uVar15 >> 1);
                  auVar59._0_8_ = -(ulong)(uVar15 & 1);
                  auVar83 = pblendvb(auVar83,(undefined1  [16])alVar108,auVar59);
                  local_260 = auVar83._8_8_;
                  auVar80 = pblendvb(auVar80,(undefined1  [16])local_228[uVar27],auVar59);
                  uVar49 = auVar80._8_8_;
                  auVar73 = pblendvb(auVar73,(undefined1  [16])local_230[uVar27],auVar59);
                  uVar28 = auVar73._8_8_;
                  auVar67 = pblendvb(auVar67,(undefined1  [16])local_238[uVar27],auVar59);
                  uVar37 = auVar67._8_8_;
                  auVar59 = auVar59 & local_198;
                  if ((((((((((((((((auVar59 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                   || (auVar59 >> 0xf & (undefined1  [16])0x1) !=
                                      (undefined1  [16])0x0) ||
                                  (auVar59 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                  ) || (auVar59 >> 0x1f & (undefined1  [16])0x1) !=
                                       (undefined1  [16])0x0) ||
                                (auVar59 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                               || (auVar59 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               ) || (auVar59 >> 0x37 & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) ||
                             (auVar59 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar59 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar59 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar59 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar59 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar59 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar59 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar59 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar59[0xf] < '\0') {
                    local_28c = (int)uVar36;
                  }
                  uVar36 = uVar36 + 1;
                  lVar23 = lVar23 + 4;
                  lVar43 = lVar43 + 4;
                  palVar17 = ptr_05;
                  b = local_228;
                  b_01 = local_238;
                  b_00 = local_230;
                  if (uVar36 == uVar32) {
                    if (s2_end == 0) {
                      uVar49 = 0;
                      uVar28 = 0;
                      uVar37 = 0;
                      local_260 = uVar1;
                    }
                    else if (iVar29 < 1) {
                      do {
                        local_260 = auVar83._0_8_;
                        auVar83._8_8_ = 0;
                        auVar83._0_8_ = local_260;
                        auVar83 = auVar83 << 0x40;
                        uVar49 = auVar80._0_8_;
                        auVar80._8_8_ = 0;
                        auVar80._0_8_ = uVar49;
                        auVar80 = auVar80 << 0x40;
                        uVar28 = auVar73._0_8_;
                        auVar73._8_8_ = 0;
                        auVar73._0_8_ = uVar28;
                        auVar73 = auVar73 << 0x40;
                        uVar37 = auVar67._0_8_;
                        auVar67._8_8_ = 0;
                        auVar67._0_8_ = uVar37;
                        auVar67 = auVar67 << 0x40;
                      } while (iVar29 < 0);
                    }
                    iVar14 = (int)uVar37;
                    iVar39 = (int)uVar28;
                    iVar20 = (int)uVar49;
                    iVar40 = iVar12;
                    if ((s1_end != 0) && ((uVar46 & 0x7ffffffe) != 0)) {
                      uVar36 = 0;
                      do {
                        uVar31 = 0;
                        if ((uVar36 & 1) != 0) {
                          uVar31 = uVar48;
                        }
                        iVar20 = uVar31 + ((uint)(uVar36 >> 1) & 0x7fffffff);
                        if (iVar20 < (int)uVar4) {
                          uVar46 = (*ptr_05)[uVar36];
                          iVar39 = iVar13;
                          if (((long)local_260 < (long)uVar46) ||
                             (((uVar46 == local_260 && (local_28c == iVar13)) &&
                              (uVar46 = local_260, iVar39 = local_28c, iVar20 < iVar40)))) {
                            uVar49 = (*local_228)[uVar36];
                            uVar28 = (*local_230)[uVar36];
                            uVar37 = (*local_238)[uVar36];
                            iVar40 = iVar20;
                            local_28c = iVar39;
                            local_260 = uVar46;
                          }
                        }
                        iVar14 = (int)uVar37;
                        iVar39 = (int)uVar28;
                        iVar20 = (int)uVar49;
                        uVar36 = uVar36 + 1;
                      } while ((uVar48 & 0x3fffffff) * 2 != (int)uVar36);
                    }
                    if (s2_end == 0 && s1_end == 0) {
                      lVar76 = ptr_05[uVar27][0];
                      local_260._0_4_ = (int)ptr_05[uVar27][1];
                      lVar71 = local_228[uVar27][0];
                      iVar20 = (int)local_228[uVar27][1];
                      lVar64 = local_230[uVar27][0];
                      iVar39 = (int)local_230[uVar27][1];
                      lVar52 = local_238[uVar27][0];
                      iVar14 = (int)local_238[uVar27][1];
                      iVar40 = iVar12;
                      local_28c = iVar13;
                      if (iVar29 < 1) {
                        do {
                          local_260._0_4_ = (int)lVar76;
                          iVar14 = (int)lVar52;
                          iVar39 = (int)lVar64;
                          iVar20 = (int)lVar71;
                          lVar76 = 0;
                          lVar71 = 0;
                          lVar64 = 0;
                          lVar52 = 0;
                        } while (iVar29 < 0);
                      }
                    }
                    auVar68._8_8_ = -(ulong)((long)sStack_170 <= (long)uVar47);
                    auVar68._0_8_ = -(ulong)((long)sVar22 <= (long)uVar47);
                    auVar74._8_8_ = -(ulong)((long)len < (long)sVar26);
                    auVar74._0_8_ = -(ulong)((long)len < (long)sVar69);
                    auVar74 = auVar74 | auVar68;
                    if ((((((((((((((((auVar74 >> 7 & (undefined1  [16])0x1) !=
                                      (undefined1  [16])0x0 ||
                                     (auVar74 >> 0xf & (undefined1  [16])0x1) !=
                                     (undefined1  [16])0x0) ||
                                    (auVar74 >> 0x17 & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) ||
                                   (auVar74 >> 0x1f & (undefined1  [16])0x1) !=
                                   (undefined1  [16])0x0) ||
                                  (auVar74 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                  ) || (auVar74 >> 0x2f & (undefined1  [16])0x1) !=
                                       (undefined1  [16])0x0) ||
                                (auVar74 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                               || (auVar74 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               ) || (auVar74 >> 0x47 & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) ||
                             (auVar74 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar74 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar74 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar74 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar74 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar74 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        auVar74[0xf] < '\0') {
                      *(byte *)&ppVar16->flag = (byte)ppVar16->flag | 0x40;
                      local_260._0_4_ = 0;
                      iVar20 = 0;
                      iVar39 = 0;
                      iVar14 = 0;
                      local_28c = 0;
                      iVar40 = 0;
                    }
                    ppVar16->score = (int)local_260;
                    ppVar16->end_query = iVar40;
                    ppVar16->end_ref = local_28c;
                    ((ppVar16->field_4).stats)->matches = iVar20;
                    ((ppVar16->field_4).stats)->similar = iVar39;
                    ((ppVar16->field_4).stats)->length = iVar14;
                    parasail_free(ptr_04);
                    parasail_free(b_04);
                    parasail_free(b_03);
                    parasail_free(b_02);
                    parasail_free(ptr_03);
                    parasail_free(ptr_02);
                    parasail_free(local_238);
                    parasail_free(ptr_01);
                    parasail_free(local_230);
                    parasail_free(ptr_00);
                    parasail_free(local_228);
                    parasail_free(ptr);
                    parasail_free(ptr_05);
                    return ppVar16;
                  }
                } while( true );
              }
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict vProfileM = NULL;
    __m128i* restrict vProfileS = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvHMStore = NULL;
    __m128i* restrict pvHMLoad = NULL;
    __m128i* restrict pvHSStore = NULL;
    __m128i* restrict pvHSLoad = NULL;
    __m128i* restrict pvHLStore = NULL;
    __m128i* restrict pvHLLoad = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvEM = NULL;
    __m128i* restrict pvES = NULL;
    __m128i* restrict pvEL = NULL;
    int64_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    __m128i vZero;
    __m128i vOne;
    int64_t score = 0;
    int64_t matches = 0;
    int64_t similar = 0;
    int64_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vMaxHM;
    __m128i vMaxHS;
    __m128i vMaxHL;
    __m128i vPosMask;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 2; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile  = (__m128i*)profile->profile64.score;
    vProfileM = (__m128i*)profile->profile64.matches;
    vProfileS = (__m128i*)profile->profile64.similar;
    vGapO = _mm_set1_epi64x_rpl(open);
    vGapE = _mm_set1_epi64x_rpl(gap);
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    vOne = _mm_set1_epi64x_rpl(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vMaxHM = vNegLimit;
    vMaxHS = vNegLimit;
    vMaxHL = vNegLimit;
    vPosMask = _mm_cmpeq_epi64(_mm_set1_epi64x_rpl(position),
            _mm_set_epi64x_rpl(0,1));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_2;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore  = parasail_memalign___m128i(16, segLen);
    pvHLoad   = parasail_memalign___m128i(16, segLen);
    pvHMStore = parasail_memalign___m128i(16, segLen);
    pvHMLoad  = parasail_memalign___m128i(16, segLen);
    pvHSStore = parasail_memalign___m128i(16, segLen);
    pvHSLoad  = parasail_memalign___m128i(16, segLen);
    pvHLStore = parasail_memalign___m128i(16, segLen);
    pvHLLoad  = parasail_memalign___m128i(16, segLen);
    pvE       = parasail_memalign___m128i(16, segLen);
    pvEM      = parasail_memalign___m128i(16, segLen);
    pvES      = parasail_memalign___m128i(16, segLen);
    pvEL      = parasail_memalign___m128i(16, segLen);
    boundary  = parasail_memalign_int64_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMStore) return NULL;
    if (!pvHMLoad) return NULL;
    if (!pvHSStore) return NULL;
    if (!pvHSLoad) return NULL;
    if (!pvHLStore) return NULL;
    if (!pvHLLoad) return NULL;
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!boundary) return NULL;

    parasail_memset___m128i(pvHMStore, vZero, segLen);
    parasail_memset___m128i(pvHSStore, vZero, segLen);
    parasail_memset___m128i(pvHLStore, vZero, segLen);
    parasail_memset___m128i(pvEM, vZero, segLen);
    parasail_memset___m128i(pvES, vZero, segLen);
    parasail_memset___m128i(pvEL, vOne, segLen);

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_64_t h;
            __m128i_64_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT64_MIN ? INT64_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vEF_opn;
        __m128i vE;
        __m128i vE_ext;
        __m128i vEM;
        __m128i vES;
        __m128i vEL;
        __m128i vF;
        __m128i vF_ext;
        __m128i vFM;
        __m128i vFS;
        __m128i vFL;
        __m128i vH;
        __m128i vH_dag;
        __m128i vHM;
        __m128i vHS;
        __m128i vHL;
        const __m128i* vP = NULL;
        const __m128i* vPM = NULL;
        const __m128i* vPS = NULL;

        /* Initialize F value to neg inf.  Any errors to vH values will
         * be corrected in the Lazy_F loop. */
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vOne;

        /* load final segment of pvHStore and shift left by 8 bytes */
        vH = _mm_load_si128(&pvHStore[segLen - 1]);
        vHM = _mm_load_si128(&pvHMStore[segLen - 1]);
        vHS = _mm_load_si128(&pvHSStore[segLen - 1]);
        vHL = _mm_load_si128(&pvHLStore[segLen - 1]);
        vH = _mm_slli_si128(vH, 8);
        vHM = _mm_slli_si128(vHM, 8);
        vHS = _mm_slli_si128(vHS, 8);
        vHL = _mm_slli_si128(vHL, 8);

        /* insert upper boundary condition */
        vH = _mm_insert_epi64_rpl(vH, boundary[j], 0);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPM = vProfileM + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPS = vProfileS + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        SWAP(pvHLoad,  pvHStore)
        SWAP(pvHMLoad, pvHMStore)
        SWAP(pvHSLoad, pvHSStore)
        SWAP(pvHLLoad, pvHLStore)

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            __m128i case1;
            __m128i case2;

            vE = _mm_load_si128(pvE+ i);
            vEM = _mm_load_si128(pvEM+ i);
            vES = _mm_load_si128(pvES+ i);
            vEL = _mm_load_si128(pvEL+ i);

            /* Get max from vH, vE and vF. */
            vH_dag = _mm_add_epi64(vH, _mm_load_si128(vP + i));
            vH = _mm_max_epi64_rpl(vH_dag, vE);
            vH = _mm_max_epi64_rpl(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);

            case1 = _mm_cmpeq_epi64(vH, vH_dag);
            case2 = _mm_cmpeq_epi64(vH, vF);

            /* calculate vM */
            vHM = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEM, vFM, case2),
                    _mm_add_epi64(vHM, _mm_load_si128(vPM + i)),
                    case1);
            _mm_store_si128(pvHMStore + i, vHM);

            /* calculate vS */
            vHS = _mm_blendv_epi8(
                    _mm_blendv_epi8(vES, vFS, case2),
                    _mm_add_epi64(vHS, _mm_load_si128(vPS + i)),
                    case1);
            _mm_store_si128(pvHSStore + i, vHS);

            /* calculate vL */
            vHL = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEL, vFL, case2),
                    _mm_add_epi64(vHL, vOne),
                    case1);
            _mm_store_si128(pvHLStore + i, vHL);

            vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vEF_opn = _mm_sub_epi64(vH, vGapO);

            /* Update vE value. */
            vE_ext = _mm_sub_epi64(vE, vGapE);
            vE = _mm_max_epi64_rpl(vEF_opn, vE_ext);
            case1 = _mm_cmpgt_epi64_rpl(vEF_opn, vE_ext);
            vEM = _mm_blendv_epi8(vEM, vHM, case1);
            vES = _mm_blendv_epi8(vES, vHS, case1);
            vEL = _mm_blendv_epi8(
                    _mm_add_epi64(vEL, vOne),
                    _mm_add_epi64(vHL, vOne),
                    case1);
            _mm_store_si128(pvE + i, vE);
            _mm_store_si128(pvEM + i, vEM);
            _mm_store_si128(pvES + i, vES);
            _mm_store_si128(pvEL + i, vEL);

            /* Update vF value. */
            vF_ext = _mm_sub_epi64(vF, vGapE);
            vF = _mm_max_epi64_rpl(vEF_opn, vF_ext);
            case1 = _mm_cmpgt_epi64_rpl(vEF_opn, vF_ext);
            vFM = _mm_blendv_epi8(vFM, vHM, case1);
            vFS = _mm_blendv_epi8(vFS, vHS, case1);
            vFL = _mm_blendv_epi8(
                    _mm_add_epi64(vFL, vOne),
                    _mm_add_epi64(vHL, vOne),
                    case1);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
            vHM = _mm_load_si128(pvHMLoad + i);
            vHS = _mm_load_si128(pvHSLoad + i);
            vHL = _mm_load_si128(pvHLLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            __m128i vHp = _mm_load_si128(&pvHLoad[segLen - 1]);
            int64_t tmp = s2_beg ? -open : (boundary[j+1]-open);
            int64_t tmp2 = tmp < INT64_MIN ? INT64_MIN : tmp;
            vHp = _mm_slli_si128(vHp, 8);
            vF = _mm_slli_si128(vF, 8);
            vFM = _mm_slli_si128(vFM, 8);
            vFS = _mm_slli_si128(vFS, 8);
            vFL = _mm_slli_si128(vFL, 8);
            vHp = _mm_insert_epi64_rpl(vHp, boundary[j], 0);
            vF = _mm_insert_epi64_rpl(vF, tmp2, 0);
            vFL = _mm_insert_epi64_rpl(vFL, 1, 0);
            for (i=0; i<segLen; ++i) {
                __m128i case1;
                __m128i case2;
                __m128i cond;

                vHp = _mm_add_epi64(vHp, _mm_load_si128(vP + i));
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi64_rpl(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                case1 = _mm_cmpeq_epi64(vH, vHp);
                case2 = _mm_cmpeq_epi64(vH, vF);
                cond = _mm_andnot_si128(case1, case2);

                /* calculate vM */
                vHM = _mm_load_si128(pvHMStore + i);
                vHM = _mm_blendv_epi8(vHM, vFM, cond);
                _mm_store_si128(pvHMStore + i, vHM);

                /* calculate vS */
                vHS = _mm_load_si128(pvHSStore + i);
                vHS = _mm_blendv_epi8(vHS, vFS, cond);
                _mm_store_si128(pvHSStore + i, vHS);

                /* calculate vL */
                vHL = _mm_load_si128(pvHLStore + i);
                vHL = _mm_blendv_epi8(vHL, vFL, cond);
                _mm_store_si128(pvHLStore + i, vHL);

                vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vH);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHM);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHS);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
                arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
                arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
                arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                /* Update vF value. */
                vEF_opn = _mm_sub_epi64(vH, vGapO);
                vF_ext = _mm_sub_epi64(vF, vGapE);
                if (! _mm_movemask_epi8(
                            _mm_or_si128(
                                _mm_cmpgt_epi64_rpl(vF_ext, vEF_opn),
                                _mm_cmpeq_epi64(vF_ext, vEF_opn))))
                    goto end;
                /*vF = _mm_max_epi64_rpl(vEF_opn, vF_ext);*/
                vF = vF_ext;
                cond = _mm_cmpgt_epi64_rpl(vEF_opn, vF_ext);
                vFM = _mm_blendv_epi8(vFM, vHM, cond);
                vFS = _mm_blendv_epi8(vFS, vHS, cond);
                vFL = _mm_blendv_epi8(
                        _mm_add_epi64(vFL, vOne),
                        _mm_add_epi64(vHL, vOne),
                        cond);
                vHp = _mm_load_si128(pvHLoad + i);
            }
        }
end:
        {
        }

        /* extract vector containing last value from the column */
        {
            __m128i cond_max;
            vH = _mm_load_si128(pvHStore + offset);
            vHM = _mm_load_si128(pvHMStore + offset);
            vHS = _mm_load_si128(pvHSStore + offset);
            vHL = _mm_load_si128(pvHLStore + offset);
            cond_max = _mm_cmpgt_epi64_rpl(vH, vMaxH);
            vMaxH = _mm_blendv_epi8(vMaxH, vH, cond_max);
            vMaxHM = _mm_blendv_epi8(vMaxHM, vHM, cond_max);
            vMaxHS = _mm_blendv_epi8(vMaxHS, vHS, cond_max);
            vMaxHL = _mm_blendv_epi8(vMaxHL, vHL, cond_max);
            if (_mm_movemask_epi8(_mm_and_si128(vPosMask, cond_max))) {
                end_ref = j;
            }
        }
#ifdef PARASAIL_ROWCOL
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128(vH, 8);
            vHM = _mm_slli_si128(vHM, 8);
            vHS = _mm_slli_si128(vHS, 8);
            vHL = _mm_slli_si128(vHL, 8);
        }
        result->stats->rowcols->score_row[j] = (int64_t) _mm_extract_epi64_rpl (vH, 1);
        result->stats->rowcols->matches_row[j] = (int64_t) _mm_extract_epi64_rpl (vHM, 1);
        result->stats->rowcols->similar_row[j] = (int64_t) _mm_extract_epi64_rpl (vHS, 1);
        result->stats->rowcols->length_row[j] = (int64_t) _mm_extract_epi64_rpl (vHL, 1);
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore+i);
        __m128i vHM = _mm_load_si128(pvHMStore+i);
        __m128i vHS = _mm_load_si128(pvHSStore+i);
        __m128i vHL = _mm_load_si128(pvHLStore+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    /* extract last value from the column maximums */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm_slli_si128(vMaxH, 8);
            vMaxHM = _mm_slli_si128(vMaxHM, 8);
            vMaxHS = _mm_slli_si128(vMaxHS, 8);
            vMaxHL = _mm_slli_si128(vMaxHL, 8);
        }
        end_query = s1Len-1;
        score = (int64_t) _mm_extract_epi64_rpl(vMaxH, 1);
        matches = (int64_t) _mm_extract_epi64_rpl(vMaxHM, 1);
        similar = (int64_t) _mm_extract_epi64_rpl(vMaxHS, 1);
        length = (int64_t) _mm_extract_epi64_rpl(vMaxHL, 1);
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int64_t *t = (int64_t*)pvHStore;
        int64_t *m = (int64_t*)pvHMStore;
        int64_t *s = (int64_t*)pvHSStore;
        int64_t *l = (int64_t*)pvHLStore;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t, ++m, ++s, ++l) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
                matches = *m;
                similar = *s;
                length = *l;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
                matches = *m;
                similar = *s;
                length = *l;
            }
        }
    }

    /* extract last value from the last column */
    if (!s1_end && !s2_end)
    {
        __m128i vH = _mm_load_si128(pvHStore + offset);
        __m128i vHM = _mm_load_si128(pvHMStore + offset);
        __m128i vHS = _mm_load_si128(pvHSStore + offset);
        __m128i vHL = _mm_load_si128(pvHLStore + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128(vH, 8);
            vHM = _mm_slli_si128(vHM, 8);
            vHS = _mm_slli_si128(vHS, 8);
            vHL = _mm_slli_si128(vHL, 8);
        }
        end_ref = s2Len - 1;
        end_query = s1Len - 1;
        score = (int64_t) _mm_extract_epi64_rpl (vH, 1);
        matches = (int64_t) _mm_extract_epi64_rpl (vHM, 1);
        similar = (int64_t) _mm_extract_epi64_rpl (vHS, 1);
        length = (int64_t) _mm_extract_epi64_rpl (vHL, 1);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi64_rpl(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(boundary);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);
    parasail_free(pvHLLoad);
    parasail_free(pvHLStore);
    parasail_free(pvHSLoad);
    parasail_free(pvHSStore);
    parasail_free(pvHMLoad);
    parasail_free(pvHMStore);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}